

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mtsr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg2;
  uintptr_t o;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    arg2 = tcg_const_i64_ppc64(tcg_ctx,(ulong)(*(ushort *)((long)&ctx->opcode + 2) & 0xf));
    gen_helper_store_sr(tcg_ctx,tcg_ctx->cpu_env,arg2,
                        *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_mtsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_const_tl(tcg_ctx, SR(ctx->opcode));
    gen_helper_store_sr(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[rS(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, t0);
}